

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Voxelizer.cpp
# Opt level: O2

shared_ptr<Voxelizer> __thiscall
Voxelizer::Create(Voxelizer *this,shared_ptr<Scene> *scene,
                 shared_ptr<myvk::CommandPool> *command_pool,uint32_t octree_level)

{
  PhysicalDevice *this_00;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Voxelizer> sVar3;
  shared_ptr<myvk::Device> device;
  __shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2> local_68;
  string local_58;
  VkExtent2D local_30;
  
  iVar2 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = *(PhysicalDevice **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"VK_EXT_conservative_rasterization",(allocator<char> *)&local_68);
  device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       myvk::PhysicalDevice::GetExtensionSupport(this_00,&local_58,(uint32_t *)0x0);
  std::make_shared<Voxelizer,bool>(&this->m_ext_conservative_rasterization_support);
  std::__cxx11::string::~string((string *)&local_58);
  lVar1 = *(long *)this;
  *(uint32_t *)(lVar1 + 200) = octree_level;
  *(int *)(lVar1 + 0xcc) = 1 << ((byte)octree_level & 0x1f);
  std::__shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2> *)(lVar1 + 8),
             &scene->super___shared_ptr<Scene,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(extraout_var_00,iVar2));
  Counter::Initialize((Counter *)(*(long *)this + 0x58),&device);
  create_descriptors(*(Voxelizer **)this,&device);
  create_render_pass(*(Voxelizer **)this,&device);
  create_pipeline(*(Voxelizer **)this,&device);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  local_30.width = *(uint32_t *)(*(long *)this + 0xcc);
  local_30.height = local_30.width;
  myvk::Framebuffer::Create
            ((Framebuffer *)&local_68,(Ptr<RenderPass> *)(*(long *)this + 0x18),
             (vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
              *)&local_58,&local_30,1);
  std::__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x28),
             &local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::~vector((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
             *)&local_58);
  count_and_create_fragment_list(*(Voxelizer **)this,command_pool);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar3.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Voxelizer>)sVar3.super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Voxelizer> Voxelizer::Create(const std::shared_ptr<Scene> &scene,
                                             const std::shared_ptr<myvk::CommandPool> &command_pool,
                                             uint32_t octree_level) {
	std::shared_ptr<Voxelizer> ret =
	    std::make_shared<Voxelizer>(command_pool->GetDevicePtr()->GetPhysicalDevicePtr()->GetExtensionSupport(
	        VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME));

	ret->m_level = octree_level;
	ret->m_voxel_resolution = 1u << octree_level;
	ret->m_scene_ptr = scene;

	std::shared_ptr<myvk::Device> device = command_pool->GetDevicePtr();
	ret->m_atomic_counter.Initialize(device);
	ret->create_descriptors(device);
	ret->create_render_pass(device);
	ret->create_pipeline(device);
	ret->m_framebuffer =
	    myvk::Framebuffer::Create(ret->m_render_pass, {}, {ret->m_voxel_resolution, ret->m_voxel_resolution});
	ret->count_and_create_fragment_list(command_pool);

	return ret;
}